

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O3

unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> cmCryptoHash::New(string_view algo)

{
  int iVar1;
  cmCryptoHash *this;
  long *in_RDX;
  char *__n;
  tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_> __args;
  
  __n = algo._M_str;
  __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
  super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)algo._M_len;
  switch(__n) {
  case (char *)0x3:
    if (*(char *)((long)in_RDX + 2) != '5' || (short)*in_RDX != 0x444d)
    goto switchD_003153b9_caseD_5;
    this = (cmCryptoHash *)operator_new(0x10);
    cmCryptoHash(this,AlgoMD5);
    break;
  case (char *)0x4:
    iVar1 = bcmp(in_RDX,"SHA1",(size_t)__n);
    if (iVar1 != 0) goto switchD_003153b9_caseD_5;
    this = (cmCryptoHash *)operator_new(0x10);
    cmCryptoHash(this,AlgoSHA1);
    break;
  case (char *)0x6:
    iVar1 = bcmp(in_RDX,"SHA224",(size_t)__n);
    if (iVar1 == 0) {
      this = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this,AlgoSHA224);
    }
    else if (*(short *)((long)in_RDX + 4) == 0x3635 && (int)*in_RDX == 0x32414853) {
      this = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this,AlgoSHA256);
    }
    else {
      if (*(short *)((long)in_RDX + 4) != 0x3438 || (int)*in_RDX != 0x33414853) {
        if (*(short *)((long)in_RDX + 4) == 0x3231 && (int)*in_RDX == 0x35414853) goto LAB_00315578;
        goto switchD_003153b9_caseD_5;
      }
      this = (cmCryptoHash *)operator_new(0x10);
      cmCryptoHash(this,AlgoSHA384);
    }
    break;
  case (char *)0x8:
    iVar1 = bcmp(in_RDX,"SHA3_224",(size_t)__n);
    if ((((iVar1 == 0) || (*in_RDX == 0x3635325f33414853)) || (*in_RDX == 0x3438335f33414853)) ||
       (*in_RDX == 0x3231355f33414853)) {
LAB_00315578:
      std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                ((Algo *)__args.
                         super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
      return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
             (tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)
             __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
             super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
    }
  default:
switchD_003153b9_caseD_5:
    *(undefined8 *)
     __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
     super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl = 0;
    return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
           (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
           __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
           super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
  }
  *(cmCryptoHash **)
   __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
   super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
         (tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)
         __args.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmCryptoHash> cmCryptoHash::New(cm::string_view algo)
{
  if (algo == "MD5") {
    return cm::make_unique<cmCryptoHash>(AlgoMD5);
  }
  if (algo == "SHA1") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA1);
  }
  if (algo == "SHA224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA224);
  }
  if (algo == "SHA256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA256);
  }
  if (algo == "SHA384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA384);
  }
  if (algo == "SHA512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA512);
  }
  if (algo == "SHA3_224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_224);
  }
  if (algo == "SHA3_256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_256);
  }
  if (algo == "SHA3_384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_384);
  }
  if (algo == "SHA3_512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_512);
  }
  return std::unique_ptr<cmCryptoHash>(nullptr);
}